

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

void sptk::swipe::printm(matrix yr_matrix)

{
  long in_RSI;
  undefined8 in_RDI;
  int j;
  int i;
  int local_18;
  int local_14;
  int local_10;
  int iStack_c;
  
  for (local_14 = 0; local_10 = (int)in_RDI, local_14 < local_10; local_14 = local_14 + 1) {
    for (local_18 = 0; iStack_c = (int)((ulong)in_RDI >> 0x20), local_18 < iStack_c;
        local_18 = local_18 + 1) {
      printf("%f\t",*(undefined8 *)(*(long *)(in_RSI + (long)local_14 * 8) + (long)local_18 * 8));
    }
    printf("\n");
  }
  return;
}

Assistant:

void printm(matrix yr_matrix) {
    int i, j;
    for (i = 0; i < yr_matrix.x; i++) {
        for (j = 0; j < yr_matrix.y; j++)
            printf("%f\t", yr_matrix.m[i][j]);
        printf("\n");
    }
}